

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
callable_impl<void,_cppcms::impl::cgi::scgi::ignore_io>::callable_impl
          (callable_impl<void,_cppcms::impl::cgi::scgi::ignore_io> *this,ignore_io *f)

{
  callable<void_(const_std::error_code_&,_unsigned_long)>::callable(&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__callable_impl_002b8c78;
  intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&this->func,
             (intrusive_ptr<booster::callable<void_()>_> *)f);
  return;
}

Assistant:

callable_impl(F f) : func(f){}